

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumePadding
          (ParsedPatternInfo *this,PadPosition paddingLocation,UErrorCode *status)

{
  ParsedSubpatternInfo *pPVar1;
  UChar32 UVar2;
  
  UVar2 = ParserState::peek(&this->state);
  if (UVar2 == 0x2a) {
    pPVar1 = this->currentSubpattern;
    if (pPVar1->hasPadding == true) {
      *status = U_MULTIPLE_PAD_SPECIFIERS;
    }
    else {
      pPVar1->paddingLocation = paddingLocation;
      pPVar1->hasPadding = true;
      ParserState::next(&this->state);
      (this->currentSubpattern->paddingEndpoints).start = (this->state).offset;
      consumeLiteral(this,status);
      (this->currentSubpattern->paddingEndpoints).end = (this->state).offset;
    }
  }
  return;
}

Assistant:

void ParsedPatternInfo::consumePadding(PadPosition paddingLocation, UErrorCode& status) {
    if (state.peek() != u'*') {
        return;
    }
    if (currentSubpattern->hasPadding) {
        state.toParseException(u"Cannot have multiple pad specifiers");
        status = U_MULTIPLE_PAD_SPECIFIERS;
        return;
    }
    currentSubpattern->paddingLocation = paddingLocation;
    currentSubpattern->hasPadding = true;
    state.next(); // consume the '*'
    currentSubpattern->paddingEndpoints.start = state.offset;
    consumeLiteral(status);
    currentSubpattern->paddingEndpoints.end = state.offset;
}